

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O2

void __thiscall
icu_63::DataBuilderCollationIterator::DataBuilderCollationIterator
          (DataBuilderCollationIterator *this,CollationDataBuilder *b)

{
  Normalizer2Impl *pNVar1;
  int iVar2;
  int32_t j;
  ulong uVar3;
  
  (this->super_CollationIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__DataBuilderCollationIterator_003de308;
  CollationIterator::CollationIterator(&this->super_CollationIterator,&this->builderData,'\0');
  (this->super_CollationIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__DataBuilderCollationIterator_003de308;
  this->builder = b;
  pNVar1 = b->nfcImpl;
  (this->builderData).base = (CollationData *)0x0;
  (this->builderData).jamoCE32s = (uint32_t *)0x0;
  (this->builderData).ces = (int64_t *)0x0;
  (this->builderData).contexts = (UChar *)0x0;
  (this->builderData).trie = (UTrie2 *)0x0;
  (this->builderData).ce32s = (uint32_t *)0x0;
  (this->builderData).nfcImpl = pNVar1;
  (this->builderData).numericPrimary = 0x12000000;
  (this->builderData).rootElements = (uint32_t *)0x0;
  (this->builderData).rootElementsLength = 0;
  (this->builderData).ce32sLength = 0;
  (this->builderData).cesLength = 0;
  *(undefined8 *)&(this->builderData).contextsLength = 0;
  *(undefined8 *)((long)&(this->builderData).compressibleBytes + 4) = 0;
  *(undefined8 *)((long)&(this->builderData).unsafeBackwardSet + 4) = 0;
  *(undefined8 *)((long)&(this->builderData).fastLatinTable + 4) = 0;
  *(undefined8 *)&(this->builderData).numScripts = 0;
  *(undefined8 *)((long)&(this->builderData).scriptsIndex + 4) = 0;
  *(undefined8 *)((long)&(this->builderData).scriptStarts + 4) = 0;
  this->s = (UnicodeString *)0x0;
  this->pos = 0;
  (this->builderData).base = b->base;
  for (uVar3 = 0; uVar3 != 0x43; uVar3 = uVar3 + 1) {
    iVar2 = 0x1180;
    if (uVar3 < 0x28) {
      iVar2 = 0x114e;
    }
    if (uVar3 < 0x13) {
      iVar2 = 0x1100;
    }
    this->jamoCE32s[uVar3] = (iVar2 + (int)uVar3) * 0x2000 | 0x1c7;
  }
  (this->builderData).jamoCE32s = this->jamoCE32s;
  return;
}

Assistant:

DataBuilderCollationIterator::DataBuilderCollationIterator(CollationDataBuilder &b)
        : CollationIterator(&builderData, /*numeric=*/ FALSE),
          builder(b), builderData(b.nfcImpl),
          s(NULL), pos(0) {
    builderData.base = builder.base;
    // Set all of the jamoCE32s[] to indirection CE32s.
    for(int32_t j = 0; j < CollationData::JAMO_CE32S_LENGTH; ++j) {  // Count across Jamo types.
        UChar32 jamo = CollationDataBuilder::jamoCpFromIndex(j);
        jamoCE32s[j] = Collation::makeCE32FromTagAndIndex(Collation::BUILDER_DATA_TAG, jamo) |
                CollationDataBuilder::IS_BUILDER_JAMO_CE32;
    }
    builderData.jamoCE32s = jamoCE32s;
}